

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(PageHeader *a,PageHeader *b)

{
  bool bVar1;
  _DictionaryPageHeader__isset _Var2;
  _PageHeader__isset _Var3;
  int32_t iVar4;
  type tVar5;
  int32_t iVar6;
  type tVar7;
  type tVar8;
  
  iVar4 = b->uncompressed_page_size;
  tVar5 = a->type;
  iVar6 = a->uncompressed_page_size;
  a->type = b->type;
  a->uncompressed_page_size = iVar4;
  b->type = tVar5;
  b->uncompressed_page_size = iVar6;
  iVar4 = a->compressed_page_size;
  a->compressed_page_size = b->compressed_page_size;
  b->compressed_page_size = iVar4;
  iVar4 = a->crc;
  a->crc = b->crc;
  b->crc = iVar4;
  swap(&a->data_page_header,&b->data_page_header);
  tVar7 = (b->dictionary_page_header).encoding;
  iVar4 = (a->dictionary_page_header).num_values;
  tVar8 = (a->dictionary_page_header).encoding;
  (a->dictionary_page_header).num_values = (b->dictionary_page_header).num_values;
  (a->dictionary_page_header).encoding = tVar7;
  (b->dictionary_page_header).num_values = iVar4;
  (b->dictionary_page_header).encoding = tVar8;
  bVar1 = (a->dictionary_page_header).is_sorted;
  (a->dictionary_page_header).is_sorted = (b->dictionary_page_header).is_sorted;
  (b->dictionary_page_header).is_sorted = bVar1;
  _Var2 = (a->dictionary_page_header).__isset;
  (a->dictionary_page_header).__isset = (b->dictionary_page_header).__isset;
  (b->dictionary_page_header).__isset = _Var2;
  swap(&a->data_page_header_v2,&b->data_page_header_v2);
  _Var3 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var3;
  return;
}

Assistant:

void swap(PageHeader &a, PageHeader &b) {
  using ::std::swap;
  swap(a.type, b.type);
  swap(a.uncompressed_page_size, b.uncompressed_page_size);
  swap(a.compressed_page_size, b.compressed_page_size);
  swap(a.crc, b.crc);
  swap(a.data_page_header, b.data_page_header);
  swap(a.index_page_header, b.index_page_header);
  swap(a.dictionary_page_header, b.dictionary_page_header);
  swap(a.data_page_header_v2, b.data_page_header_v2);
  swap(a.__isset, b.__isset);
}